

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O0

int __thiscall zmq::stream_engine_base_t::write_credential(stream_engine_base_t *this,msg_t *msg_)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  void *__dest;
  uchar *__src;
  int *piVar4;
  char *pcVar5;
  undefined8 in_RSI;
  msg_t *in_RDI;
  char *errstr;
  int rc;
  msg_t msg;
  blob_t *credential;
  size_t in_stack_ffffffffffffff80;
  msg_t local_60;
  blob_t *local_20;
  undefined8 local_18;
  
  local_18 = in_RSI;
  if (in_RDI[0x15]._u.base.metadata == (metadata_t *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_mechanism != NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0x259);
    fflush(_stderr);
    zmq_abort((char *)0x3091ba);
  }
  if (in_RDI[0x19]._u.lmsg.content == (content_t *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_session != NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0x25a);
    fflush(_stderr);
    zmq_abort((char *)0x30921d);
  }
  local_20 = mechanism_t::get_user_id((mechanism_t *)in_RDI[0x15]._u.base.metadata);
  sVar3 = blob_t::size(local_20);
  if (sVar3 != 0) {
    blob_t::size(local_20);
    iVar1 = msg_t::init_size(in_RDI,in_stack_ffffffffffffff80);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == 0",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
              ,0x260);
      fflush(_stderr);
      zmq_abort((char *)0x3092bb);
    }
    __dest = msg_t::data(in_RDI);
    __src = blob_t::data(local_20);
    sVar3 = blob_t::size(local_20);
    memcpy(__dest,__src,sVar3);
    msg_t::set_flags(&local_60,' ');
    iVar1 = (int)&local_60;
    iVar2 = (**(code **)((long)(in_RDI[0x19]._u.lmsg.content)->data + 0xe8))();
    if (iVar2 == -1) {
      iVar1 = msg_t::close(&local_60,iVar1);
      if (iVar1 != 0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
                ,0x266);
        fflush(_stderr);
        zmq_abort((char *)0x30939f);
      }
      return -1;
    }
  }
  *(undefined8 *)((long)&in_RDI[0x15]._u + 0x20) = 0;
  *(undefined8 *)((long)&in_RDI[0x15]._u + 0x18) = 0x69;
  iVar1 = (*(code *)(in_RDI->_u).base.metadata[1]._dict._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count)(in_RDI,local_18);
  return iVar1;
}

Assistant:

int zmq::stream_engine_base_t::write_credential (msg_t *msg_)
{
    zmq_assert (_mechanism != NULL);
    zmq_assert (_session != NULL);

    const blob_t &credential = _mechanism->get_user_id ();
    if (credential.size () > 0) {
        msg_t msg;
        int rc = msg.init_size (credential.size ());
        zmq_assert (rc == 0);
        memcpy (msg.data (), credential.data (), credential.size ());
        msg.set_flags (msg_t::credential);
        rc = _session->push_msg (&msg);
        if (rc == -1) {
            rc = msg.close ();
            errno_assert (rc == 0);
            return -1;
        }
    }
    _process_msg = &stream_engine_base_t::decode_and_push;
    return decode_and_push (msg_);
}